

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int flatcc_verify_string_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  flatbuffers_uoffset_t base;
  uint local_24;
  
  local_24 = (uint)((ulong)in_RAX >> 0x20);
  iVar4 = get_offset_field(td,id,required,&local_24);
  if (local_24 != 0 && iVar4 == 0) {
    pvVar2 = td->buf;
    iVar1 = *(int *)((long)pvVar2 + (ulong)local_24);
    uVar7 = iVar1 + local_24;
    iVar4 = 0x10;
    if (local_24 < uVar7) {
      uVar9 = td->end;
      uVar5 = (ulong)uVar9;
      uVar8 = (ulong)uVar7;
      bVar3 = uVar8 + 4 <= uVar5;
      bVar10 = (uVar7 & 3) == 0;
      if (bVar10 && bVar3) {
        uVar6 = *(uint *)((long)pvVar2 + uVar8);
        if ((uVar6 < 0x40000000 && (uVar7 & 3) == 0) && (uVar6 * 4 <= (uVar9 - uVar7) - 4)) {
          if (uVar6 != 0) {
            uVar7 = iVar1 + local_24;
            iVar4 = ((uVar9 - iVar1) - local_24) + -8;
            do {
              uVar7 = uVar7 + 4;
              iVar1 = *(int *)((long)pvVar2 + (ulong)uVar7);
              uVar9 = uVar7 + iVar1;
              if (uVar9 <= uVar7) {
                return 0x11;
              }
              uVar8 = (ulong)uVar9;
              bVar3 = uVar5 < uVar8 + 4;
              bVar10 = (uVar9 & 3) != 0;
              if (bVar10 || bVar3) {
                return 0x11;
              }
              uVar9 = iVar4 - iVar1;
              if ((uVar9 <= *(uint *)((long)pvVar2 + uVar8)) ||
                 (*(char *)((long)pvVar2 +
                           (ulong)*(uint *)((long)pvVar2 + uVar8) + (ulong)(uVar7 + iVar1 + 4)) !=
                  '\0')) {
                if (bVar10 || bVar3) {
                  return 0x11;
                }
                uVar6 = *(uint *)((long)pvVar2 + uVar8);
                if (uVar6 < uVar9) {
                  if (*(char *)((long)pvVar2 + (ulong)uVar6 + (ulong)(uVar7 + iVar1 + 4)) != '\0') {
                    return 7;
                  }
                  return 0;
                }
                return (uint)(uVar6 < uVar9) * 9 + 8;
              }
              iVar4 = iVar4 + -4;
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
          }
          iVar4 = 0;
        }
        else if ((bVar10 && bVar3) && ((uVar7 & 3) == 0)) {
          uVar6 = *(uint *)((long)pvVar2 + uVar8);
          if (uVar6 < 0x40000000) {
            iVar4 = 0x1a;
            if (uVar6 << 2 <= (uVar9 - uVar7) - 4) {
              iVar4 = 0;
            }
          }
          else {
            iVar4 = (uint)(uVar6 >= 0x40000000) * 9 + 0x10;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int flatcc_verify_string_vector_field(flatcc_table_verifier_descriptor_t *td,
    voffset_t id, int required)
{
    uoffset_t base;

    check_field(td, id, required, base);
    return verify_string_vector(td->buf, td->end, base, read_uoffset(td->buf, base));
}